

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pool.hpp
# Opt level: O0

void __thiscall iutest::detail::iuPool::~iuPool(iuPool *this)

{
  bool bVar1;
  reference ppiVar2;
  const_iterator local_38;
  iuIObject **local_30;
  iuIObject *local_28;
  value_ptr p;
  __normal_iterator<iutest::detail::iuIObject_**,_std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>_>
  local_18;
  iterator it;
  iuPool *this_local;
  
  it._M_current = (iuIObject **)this;
  local_18._M_current =
       (iuIObject **)
       std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::begin
                 (&this->m_pool);
  while( true ) {
    p = (value_ptr)
        std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::end
                  (&this->m_pool);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<iutest::detail::iuIObject_**,_std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>_>
                        *)&p);
    if (!bVar1) break;
    ppiVar2 = __gnu_cxx::
              __normal_iterator<iutest::detail::iuIObject_**,_std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppiVar2;
    __gnu_cxx::
    __normal_iterator<iutest::detail::iuIObject*const*,std::vector<iutest::detail::iuIObject*,std::allocator<iutest::detail::iuIObject*>>>
    ::__normal_iterator<iutest::detail::iuIObject**>
              ((__normal_iterator<iutest::detail::iuIObject*const*,std::vector<iutest::detail::iuIObject*,std::allocator<iutest::detail::iuIObject*>>>
                *)&local_38,&local_18);
    local_30 = (iuIObject **)
               std::
               vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::
               erase(&this->m_pool,local_38);
    local_18._M_current = local_30;
    if (local_28 != (iuIObject *)0x0) {
      (*local_28->_vptr_iuIObject[1])();
    }
  }
  std::vector<iutest::detail::iuIObject_*,_std::allocator<iutest::detail::iuIObject_*>_>::~vector
            (&this->m_pool);
  return;
}

Assistant:

~iuPool()
    {
        // すべて解放する
        for( pool::iterator it=m_pool.begin(); it != m_pool.end(); )
        {
            value_ptr p = *it;
            it = m_pool.erase(it);
            delete p;
        }
    }